

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

void __thiscall
cmGeneratorTarget::GetExtraSources
          (cmGeneratorTarget *this,
          vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *data,string *config)

{
  pointer ppcVar1;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> sourceFiles;
  TagVisitor<ExtraSourcesTag,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
  visitor;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> local_138;
  TagVisitor<ExtraSourcesTag,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
  local_118;
  
  local_138.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_138.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_138.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  GetSourceFiles(this,&local_138,config);
  TagVisitor<ExtraSourcesTag,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
  ::TagVisitor(&local_118,this,data);
  if (local_138.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_138.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    ppcVar1 = local_138.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      TagVisitor<ExtraSourcesTag,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
      ::Accept(&local_118,*ppcVar1);
      ppcVar1 = ppcVar1 + 1;
    } while (ppcVar1 !=
             local_138.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  TagVisitor<ExtraSourcesTag,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
  ::~TagVisitor(&local_118);
  if (local_138.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_138.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_138.
                          super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_138.
                          super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void cmGeneratorTarget
::GetExtraSources(std::vector<cmSourceFile const*>& data,
                  const std::string& config) const
{
  IMPLEMENT_VISIT(ExtraSources);
}